

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

_Bool cdns_validate_cfg(void)

{
  server_info *psVar1;
  undefined4 uVar2;
  uint16_t uVar3;
  int iVar4;
  sockaddr *addr_1;
  undefined1 local_20 [4];
  int len;
  in6_addr addr;
  uint i;
  _Bool rc;
  
  addr.__in6_u.__u6_addr8[0xf] = '\x01';
  iVar4 = evutil_inet_pton(2,g_cdns_cfg.local_ip,local_20);
  if ((iVar4 != 1) && (iVar4 = evutil_inet_pton(10,g_cdns_cfg.local_ip,local_20), iVar4 != 1)) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0xbd,
               "cdns_validate_cfg",0,3,"Invalid IP specified for listening address");
    addr.__in6_u.__u6_addr8[0xf] = '\0';
  }
  if (g_cdns_cfg.local_port == 0) {
    g_cdns_cfg.local_port = 0x35;
  }
  if (g_cdns_cfg.timeout == 0) {
    g_cdns_cfg.timeout = 4;
  }
  if (g_svr_count == 0) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",199,
               "cdns_validate_cfg",0,3,"No upstream DNS server specified");
    addr.__in6_u.__u6_addr8[0xf] = '\0';
  }
  for (addr.__in6_u.__u6_addr32[2] = 0; uVar2 = addr.__in6_u.__u6_addr32[2], psVar1 = g_svr_cfg,
      addr.__in6_u.__u6_addr32[2] < g_svr_count;
      addr.__in6_u.__u6_addr32[2] = addr.__in6_u.__u6_addr32[2] + 1) {
    if (g_svr_cfg[addr.__in6_u.__u6_addr32[2]].ip_port == (char *)0x0) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0xd8,
                 "cdns_validate_cfg",0,3,"IP:port pair is required");
      addr.__in6_u.__u6_addr8[0xf] = '\0';
    }
    else {
      addr_1._4_4_ = 0x80;
      iVar4 = evutil_parse_sockaddr_port
                        (g_svr_cfg[addr.__in6_u.__u6_addr32[2]].ip_port,
                         &g_svr_cfg[addr.__in6_u.__u6_addr32[2]].addr,(long)&addr_1 + 4);
      if (iVar4 != 0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0xcf,"cdns_validate_cfg",0,3,"Invalid IP:port pair for upstream DNS server: %s",
                   g_svr_cfg[addr.__in6_u.__u6_addr32[2]].ip_port);
        addr.__in6_u.__u6_addr8[0xf] = '\0';
      }
      if ((g_svr_cfg[addr.__in6_u.__u6_addr32[2]].addr.ss_family == 2) &&
         (*(short *)psVar1[(uint)uVar2].addr.__ss_padding == 0)) {
        uVar3 = htons(0x35);
        *(uint16_t *)psVar1[(uint)uVar2].addr.__ss_padding = uVar3;
      }
      else if ((g_svr_cfg[addr.__in6_u.__u6_addr32[2]].addr.ss_family == 10) &&
              (*(short *)psVar1[(uint)uVar2].addr.__ss_padding == 0)) {
        uVar3 = htons(0x35);
        *(uint16_t *)psVar1[(uint)uVar2].addr.__ss_padding = uVar3;
      }
    }
  }
  return (_Bool)(addr.__in6_u.__u6_addr8[0xf] & 1);
}

Assistant:

bool cdns_validate_cfg()
{
    bool rc = true;
    unsigned int i;
    struct in6_addr addr;
    int len;

    if (evutil_inet_pton(AF_INET, g_cdns_cfg.local_ip, &addr) != 1
        && evutil_inet_pton(AF_INET6, g_cdns_cfg.local_ip, &addr) != 1) {
        log_error(LOG_ERR, "Invalid IP specified for listening address");
        rc = false;
    }
    if (g_cdns_cfg.local_port == 0)
        g_cdns_cfg.local_port = DNS_DEFAULT_PORT;
    if (g_cdns_cfg.timeout == 0)
        g_cdns_cfg.timeout = DEFAULT_TIMEOUT_SECONDS;

    // Validate servers
    if (g_svr_count == 0) {
        log_error(LOG_ERR, "No upstream DNS server specified");
        rc = false;
    }
    for (i = 0; i < g_svr_count; i++) {
        if (g_svr_cfg[i].ip_port) {
            struct sockaddr * addr = (struct sockaddr*)&g_svr_cfg[i].addr;
            len = sizeof(g_svr_cfg[i].addr);
            if (evutil_parse_sockaddr_port(g_svr_cfg[i].ip_port, addr, &len)) {
                log_error(LOG_ERR, "Invalid IP:port pair for upstream DNS server: %s", g_svr_cfg[i].ip_port);
                rc = false;
            }
            if (g_svr_cfg[i].addr.ss_family == AF_INET && ((struct sockaddr_in*)addr)->sin_port == 0)
                ((struct sockaddr_in*)addr)->sin_port = htons(DNS_DEFAULT_PORT);
            else if (g_svr_cfg[i].addr.ss_family == AF_INET6 && ((struct sockaddr_in6*)addr)->sin6_port == 0)
                ((struct sockaddr_in6*)addr)->sin6_port = htons(DNS_DEFAULT_PORT);
        }
        else {
            log_error(LOG_ERR, "IP:port pair is required");
            rc = false;   
        }
    }
    return rc;
}